

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O0

saint_t inverse_bw_transform(sauchar_t *T,sauchar_t *U,saidx_t *A,saidx_t n,saidx_t idx)

{
  int iVar1;
  saidx_t sVar2;
  int in_ECX;
  void *in_RDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  saint_t d;
  saint_t c;
  saidx_t p;
  saidx_t i;
  saidx_t *B;
  sauchar_t D [256];
  saidx_t C [256];
  int local_540;
  int local_53c;
  int local_538;
  int local_534;
  void *local_530;
  byte abStack_528 [256];
  saidx_t local_428 [256];
  int local_28;
  int local_24;
  void *local_20;
  long local_18;
  long local_10;
  saint_t local_4;
  
  if (((((in_RDI == 0) || (in_RSI == 0)) || (in_ECX < 0)) || ((in_R8D < 0 || (in_ECX < in_R8D)))) ||
     ((0 < in_ECX && (in_R8D == 0)))) {
    local_4 = -1;
  }
  else if (in_ECX < 2) {
    local_4 = 0;
  }
  else {
    local_530 = in_RDX;
    local_28 = in_R8D;
    local_24 = in_ECX;
    local_20 = in_RDX;
    local_18 = in_RSI;
    local_10 = in_RDI;
    if ((in_RDX == (void *)0x0) && (local_530 = malloc((long)in_ECX << 2), local_530 == (void *)0x0)
       ) {
      local_4 = -2;
    }
    else {
      for (local_53c = 0; local_53c < 0x100; local_53c = local_53c + 1) {
        local_428[local_53c] = 0;
      }
      for (local_534 = 0; local_534 < local_24; local_534 = local_534 + 1) {
        local_428[*(byte *)(local_10 + local_534)] = local_428[*(byte *)(local_10 + local_534)] + 1;
      }
      local_540 = 0;
      local_534 = 0;
      for (local_53c = 0; local_53c < 0x100; local_53c = local_53c + 1) {
        iVar1 = local_428[local_53c];
        if (0 < iVar1) {
          local_428[local_53c] = local_534;
          abStack_528[local_540] = (byte)local_53c;
          local_534 = iVar1 + local_534;
          local_540 = local_540 + 1;
        }
      }
      for (local_534 = 0; local_534 < local_28; local_534 = local_534 + 1) {
        iVar1 = local_428[*(byte *)(local_10 + local_534)];
        local_428[*(byte *)(local_10 + local_534)] = iVar1 + 1;
        *(int *)((long)local_530 + (long)iVar1 * 4) = local_534;
      }
      for (; local_534 < local_24; local_534 = local_534 + 1) {
        iVar1 = local_428[*(byte *)(local_10 + local_534)];
        local_428[*(byte *)(local_10 + local_534)] = iVar1 + 1;
        *(int *)((long)local_530 + (long)iVar1 * 4) = local_534 + 1;
      }
      for (local_53c = 0; local_53c < local_540; local_53c = local_53c + 1) {
        local_428[local_53c] = local_428[abStack_528[local_53c]];
      }
      local_538 = local_28;
      for (local_534 = 0; local_534 < local_24; local_534 = local_534 + 1) {
        sVar2 = binarysearch_lower(local_428,local_540,local_538);
        *(byte *)(local_18 + local_534) = abStack_528[sVar2];
        local_538 = *(int *)((long)local_530 + (long)(local_538 + -1) * 4);
      }
      if (local_20 == (void *)0x0) {
        free(local_530);
      }
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

saint_t
inverse_bw_transform(const sauchar_t *T, sauchar_t *U, saidx_t *A,
                     saidx_t n, saidx_t idx) {
  saidx_t C[ALPHABET_SIZE];
  sauchar_t D[ALPHABET_SIZE];
  saidx_t *B;
  saidx_t i, p;
  saint_t c, d;

  /* Check arguments. */
  if((T == NULL) || (U == NULL) || (n < 0) || (idx < 0) ||
     (n < idx) || ((0 < n) && (idx == 0))) {
    return -1;
  }
  if(n <= 1) { return 0; }

  if((B = A) == NULL) {
    /* Allocate n*sizeof(saidx_t) bytes of memory. */
    if((B = (saidx_t *)malloc((size_t)n * sizeof(saidx_t))) == NULL) { return -2; }
  }

  /* Inverse BW transform. */
  for(c = 0; c < ALPHABET_SIZE; ++c) { C[c] = 0; }
  for(i = 0; i < n; ++i) { ++C[T[i]]; }
  for(c = 0, d = 0, i = 0; c < ALPHABET_SIZE; ++c) {
    p = C[c];
    if(0 < p) {
      C[c] = i;
      D[d++] = (sauchar_t)c;
      i += p;
    }
  }
  for(i = 0; i < idx; ++i) { B[C[T[i]]++] = i; }
  for( ; i < n; ++i)       { B[C[T[i]]++] = i + 1; }
  for(c = 0; c < d; ++c) { C[c] = C[D[c]]; }
  for(i = 0, p = idx; i < n; ++i) {
    U[i] = D[binarysearch_lower(C, d, p)];
    p = B[p - 1];
  }

  if(A == NULL) {
    /* Deallocate memory. */
    free(B);
  }

  return 0;
}